

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinR2SCAN_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  double in_RCX;
  double in_RDX;
  double in_RSI;
  int in_EDI;
  double *in_R8;
  long in_R9;
  double in_XMM0_Qa;
  double unaff_retaddr;
  double in_stack_00000008;
  double e;
  double lapl_i_b;
  double lapl_i_a;
  double *lapl_i;
  double *tau_i;
  double *sigma_i;
  double *rho_i;
  int32_t i;
  undefined8 local_78;
  undefined4 local_3c;
  undefined4 in_stack_fffffffffffffff0;
  
  for (local_3c = 0; local_3c < in_EDI; local_3c = local_3c + 1) {
    mgga_screening_interface<ExchCXX::BuiltinR2SCAN_X>::eval_exc_polar
              (e,in_stack_00000008,unaff_retaddr,in_XMM0_Qa,
               (double)CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_RSI,in_RDX,in_RCX,lapl_i_a,
               in_R8);
    *(double *)(in_R9 + (long)local_3c * 8) =
         in_XMM0_Qa * local_78 + *(double *)(in_R9 + (long)local_3c * 8);
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;
    auto* tau_i   = tau   + 2*i;
    auto* lapl_i  = lapl  + 2*i;

    const auto lapl_i_a = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const auto lapl_i_b = traits::needs_laplacian ? lapl_i[1] : 0.0;
   
    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_i_a, lapl_i_b, tau_i[0], tau_i[1], 
      e );
    eps[i] += scal_fact * e;

  }

}